

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::piece_picker::is_hashing(piece_picker *this,piece_index_t piece)

{
  bool bVar1;
  iterator iVar2;
  download_queue_t queue;
  uint uVar3;
  
  uVar3 = *(uint *)((this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + piece.m_val);
  queue.m_val = (byte)(uVar3 >> 0x1a) & 7;
  bVar1 = false;
  if (queue.m_val != 4) {
    uVar3 = uVar3 >> 0x1a & 7;
    if (uVar3 == 5) {
      queue.m_val = '\0';
    }
    else if (uVar3 == 6) {
      queue.m_val = '\x01';
    }
    iVar2 = find_dl_piece(this,queue,piece);
    bVar1 = SUB21((ushort)*(undefined2 *)&(iVar2._M_current)->field_0xa >> 0xf,0);
  }
  return bVar1;
}

Assistant:

bool piece_picker::is_hashing(piece_index_t const piece) const
	{
		piece_pos const& p = m_piece_map[piece];
		auto const state = p.download_queue();
		if (state == piece_pos::piece_open)
			return false;
		auto const i = find_dl_piece(state, piece);
		TORRENT_ASSERT(i != m_downloads[state].end());
		return i->hashing > 0;
	}